

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

char * anon_unknown.dwarf_1307e9::ReadAttribute
                 (string *name,string *ty,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *data,char *ptr)

{
  bool bVar1;
  uint *puVar2;
  reference __dest;
  char *in_RCX;
  size_type in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  int dataLen;
  char *p;
  string *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  char *local_8;
  
  if (*in_RCX == '\0') {
    local_8 = (char *)0x0;
  }
  else {
    ReadString(in_stack_00000030,(char *)name);
    puVar2 = (uint *)ReadString(in_stack_00000030,(char *)name);
    uVar3 = *puVar2;
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar2 + 1);
    bVar1 = IsBigEndian();
    if (bVar1) {
      swap4((uint *)&stack0xffffffffffffffcc);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_RDI,in_RSI);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (this,CONCAT44(uVar3,in_stack_ffffffffffffffc8));
    memcpy(__dest,this,(long)(int)uVar3);
    local_8 = (char *)((long)&(this->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start + (long)(int)uVar3);
  }
  return local_8;
}

Assistant:

const char *ReadAttribute(std::string &name, std::string &ty,
                          std::vector<unsigned char> &data, const char *ptr) {

  if ((*ptr) == 0) {
    // end of attribute.
    return NULL;
  }

  const char *p = ReadString(name, ptr);

  p = ReadString(ty, p);

  int dataLen;
  memcpy(&dataLen, p, sizeof(int));
  p += 4;

  if (IsBigEndian()) {
    swap4(reinterpret_cast<unsigned int *>(&dataLen));
  }

  data.resize(dataLen);
  memcpy(&data.at(0), p, dataLen);
  p += dataLen;

  return p;
}